

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

bool __thiscall
ObjectIdentifier::DecodeLong
          (ObjectIdentifier *this,uchar *in,size_t cbIn,unsigned_long *out,size_t *cbRead)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar5 = 6;
  if (cbIn < 6) {
    sVar5 = cbIn;
  }
  uVar3 = 0;
  for (sVar2 = 0;
      (sVar6 = sVar5, sVar5 != sVar2 &&
      (uVar3 = uVar3 | in[sVar2] & 0x7f, sVar6 = sVar2, (char)in[sVar2] < '\0')); sVar2 = sVar2 + 1)
  {
    uVar3 = uVar3 << 7;
  }
  bVar1 = uVar3 >> 0x20 == 0;
  iVar4 = (int)sVar6;
  if (bVar1 && iVar4 != 6) {
    *out = uVar3;
    *cbRead = (ulong)(iVar4 + 1);
  }
  return bVar1 && iVar4 != 6;
}

Assistant:

bool ObjectIdentifier::DecodeLong(const unsigned char * in, size_t cbIn, unsigned long & out, size_t & cbRead) const
{
	unsigned long long tmp = 0;

	unsigned int i;
	for (i = 0; i < cbIn && i < 6; ++i)
	{
		// we can't possibly overflow a 64-bit value with only 42 bits of input
		tmp += 0x7f & in[i];

		if ((in[i] & 0x80) == 0)
			break;

		tmp <<= 7;
	}

	if (tmp >> 32 != 0 || i == 6)
	{
		// malformed input
		return false;
	}

	out = static_cast<unsigned long>(tmp);
	cbRead = i + 1;
	return true;
}